

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.h
# Opt level: O1

void __thiscall chrono::ChLinkMateOrthogonal::ChLinkMateOrthogonal(ChLinkMateOrthogonal *this)

{
  ChLinkMateGeneric::ChLinkMateGeneric
            (&this->super_ChLinkMateGeneric,false,false,false,true,false,false);
  (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem
  .super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkMateGeneric_00b44158;
  (this->reldir1).m_data[0] = VECT_X;
  (this->reldir1).m_data[1] = DAT_00b90ad8;
  (this->reldir1).m_data[2] = DAT_00b90ae0;
  (this->reldir2).m_data[0] = VECT_Y;
  (this->reldir2).m_data[1] = DAT_00b90af0;
  (this->reldir2).m_data[2] = DAT_00b90af8;
  return;
}

Assistant:

virtual ~ChLinkMateOrthogonal() {}